

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joystickmenu.cpp
# Opt level: O0

void UpdateJoystickMenu(IJoystickConfig *selected)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  FOptionMenuItem **ppFVar5;
  IJoystickConfig **ppIVar6;
  FOptionMenuItemOption *this;
  FOptionMenuItem *pFVar7;
  FOptionMenuItemJoyConfigMenu *pFVar8;
  char *label;
  FString local_58;
  uint local_50;
  int i_2;
  uint local_3c;
  uint local_38;
  int itemnum;
  int i;
  uint i_1;
  FOptionMenuItem *it;
  FOptionMenuDescriptor *opt;
  FMenuDescriptor **local_18;
  FMenuDescriptor **desc;
  IJoystickConfig *selected_local;
  
  desc = (FMenuDescriptor **)selected;
  FName::FName((FName *)((long)&opt + 4),NAME_JoystickOptions);
  local_18 = TMap<FName,_FMenuDescriptor_*,_THashTraits<FName>,_TValueTraits<FMenuDescriptor_*>_>::
             CheckKey(&MenuDescriptors,(FName *)((long)&opt + 4));
  if ((local_18 != (FMenuDescriptor **)0x0) && ((*local_18)->mType == 1)) {
    it = (FOptionMenuItem *)*local_18;
    for (itemnum = 0; iVar1 = itemnum,
        uVar3 = TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Size
                          ((TArray<FOptionMenuItem_*,_FOptionMenuItem_*> *)(it + 1)),
        (uint)iVar1 < uVar3; itemnum = itemnum + 1) {
      ppFVar5 = TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::operator[]
                          ((TArray<FOptionMenuItem_*,_FOptionMenuItem_*> *)(it + 1),
                           (ulong)(uint)itemnum);
      if (*ppFVar5 != (FOptionMenuItem *)0x0) {
        (*((*ppFVar5)->super_FListMenuItem)._vptr_FListMenuItem[1])();
      }
    }
    TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Clear
              ((TArray<FOptionMenuItem_*,_FOptionMenuItem_*> *)(it + 1));
    local_3c = 0xffffffff;
    I_GetJoysticks(&Joysticks);
    uVar3 = local_3c;
    uVar4 = TArray<IJoystickConfig_*,_IJoystickConfig_*>::Size(&Joysticks);
    if (uVar4 <= uVar3) {
      local_3c = TArray<IJoystickConfig_*,_IJoystickConfig_*>::Size(&Joysticks);
      local_3c = local_3c - 1;
    }
    if (desc != (FMenuDescriptor **)0x0) {
      for (local_38 = 0; uVar3 = local_38,
          uVar4 = TArray<IJoystickConfig_*,_IJoystickConfig_*>::Size(&Joysticks), uVar3 < uVar4;
          local_38 = local_38 + 1) {
        ppIVar6 = TArray<IJoystickConfig_*,_IJoystickConfig_*>::operator[]
                            (&Joysticks,(long)(int)local_38);
        if (*ppIVar6 == (IJoystickConfig *)desc) {
          local_3c = local_38;
          break;
        }
      }
    }
    this = (FOptionMenuItemOption *)operator_new(0x40);
    FOptionMenuItemOption::FOptionMenuItemOption
              (this,"Enable controller support","use_joystick","YesNo",(char *)0x0,0);
    _i = this;
    TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Push
              ((TArray<FOptionMenuItem_*,_FOptionMenuItem_*> *)(it + 1),(FOptionMenuItem **)&i);
    pFVar7 = (FOptionMenuItem *)operator_new(0x28);
    FOptionMenuItemStaticText::FOptionMenuItemStaticText
              ((FOptionMenuItemStaticText *)pFVar7," ",false);
    _i = (FOptionMenuItemOption *)pFVar7;
    TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Push
              ((TArray<FOptionMenuItem_*,_FOptionMenuItem_*> *)(it + 1),(FOptionMenuItem **)&i);
    uVar3 = TArray<IJoystickConfig_*,_IJoystickConfig_*>::Size(&Joysticks);
    if (uVar3 == 0) {
      pFVar8 = (FOptionMenuItemJoyConfigMenu *)operator_new(0x28);
      FOptionMenuItemStaticText::FOptionMenuItemStaticText
                ((FOptionMenuItemStaticText *)pFVar8,"No controllers detected",false);
      _i = (FOptionMenuItemOption *)pFVar8;
      TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Push
                ((TArray<FOptionMenuItem_*,_FOptionMenuItem_*> *)(it + 1),(FOptionMenuItem **)&i);
      bVar2 = FBoolCVar::operator_cast_to_bool(&use_joystick);
      if (!bVar2) {
        pFVar7 = (FOptionMenuItem *)operator_new(0x28);
        FOptionMenuItemStaticText::FOptionMenuItemStaticText
                  ((FOptionMenuItemStaticText *)pFVar7,"Controller support must be",false);
        _i = (FOptionMenuItemOption *)pFVar7;
        TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Push
                  ((TArray<FOptionMenuItem_*,_FOptionMenuItem_*> *)(it + 1),(FOptionMenuItem **)&i);
        pFVar8 = (FOptionMenuItemJoyConfigMenu *)operator_new(0x28);
        FOptionMenuItemStaticText::FOptionMenuItemStaticText
                  ((FOptionMenuItemStaticText *)pFVar8,"enabled to detect any",false);
        _i = (FOptionMenuItemOption *)pFVar8;
        TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Push
                  ((TArray<FOptionMenuItem_*,_FOptionMenuItem_*> *)(it + 1),(FOptionMenuItem **)&i);
      }
    }
    else {
      pFVar8 = (FOptionMenuItemJoyConfigMenu *)operator_new(0x28);
      FOptionMenuItemStaticText::FOptionMenuItemStaticText
                ((FOptionMenuItemStaticText *)pFVar8,"Configure controllers:",false);
      _i = (FOptionMenuItemOption *)pFVar8;
      TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Push
                ((TArray<FOptionMenuItem_*,_FOptionMenuItem_*> *)(it + 1),(FOptionMenuItem **)&i);
      for (local_50 = 0; uVar3 = local_50,
          uVar4 = TArray<IJoystickConfig_*,_IJoystickConfig_*>::Size(&Joysticks),
          (int)uVar3 < (int)uVar4; local_50 = local_50 + 1) {
        pFVar8 = (FOptionMenuItemJoyConfigMenu *)operator_new(0x30);
        ppIVar6 = TArray<IJoystickConfig_*,_IJoystickConfig_*>::operator[]
                            (&Joysticks,(long)(int)local_50);
        (*(*ppIVar6)->_vptr_IJoystickConfig[2])(&local_58);
        label = FString::operator_cast_to_char_(&local_58);
        ppIVar6 = TArray<IJoystickConfig_*,_IJoystickConfig_*>::operator[]
                            (&Joysticks,(long)(int)local_50);
        FOptionMenuItemJoyConfigMenu::FOptionMenuItemJoyConfigMenu(pFVar8,label,*ppIVar6);
        _i = (FOptionMenuItemOption *)pFVar8;
        FString::~FString(&local_58);
        TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Push
                  ((TArray<FOptionMenuItem_*,_FOptionMenuItem_*> *)(it + 1),(FOptionMenuItem **)&i);
        if (local_50 == local_3c) {
          uVar3 = TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Size
                            ((TArray<FOptionMenuItem_*,_FOptionMenuItem_*> *)(it + 1));
          *(uint *)&it[1].mLabel.Chars = uVar3;
        }
      }
    }
    iVar1 = *(int *)&it[1].mLabel.Chars;
    uVar3 = TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Size
                      ((TArray<FOptionMenuItem_*,_FOptionMenuItem_*> *)(it + 1));
    if ((int)uVar3 <= iVar1) {
      uVar3 = TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Size
                        ((TArray<FOptionMenuItem_*,_FOptionMenuItem_*> *)(it + 1));
      *(uint *)&it[1].mLabel.Chars = uVar3 - 1;
    }
    FOptionMenuDescriptor::CalcIndent((FOptionMenuDescriptor *)it);
    local_38 = 0;
    while ((uVar3 = local_38, uVar4 = TArray<IJoystickConfig_*,_IJoystickConfig_*>::Size(&Joysticks)
           , uVar3 < uVar4 &&
           (ppIVar6 = TArray<IJoystickConfig_*,_IJoystickConfig_*>::operator[]
                                (&Joysticks,(long)(int)local_38), *ppIVar6 != SELECTED_JOYSTICK))) {
      local_38 = local_38 + 1;
    }
    uVar3 = local_38;
    uVar4 = TArray<IJoystickConfig_*,_IJoystickConfig_*>::Size(&Joysticks);
    if ((uVar3 == uVar4) &&
       ((SELECTED_JOYSTICK = (IJoystickConfig *)0x0, DMenu::CurrentMenu != (DMenu *)0x0 &&
        (bVar2 = DObject::IsKindOf(&DMenu::CurrentMenu->super_DObject,
                                   DJoystickConfigMenu::RegistrationInfo.MyClass), bVar2)))) {
      (*(DMenu::CurrentMenu->super_DObject)._vptr_DObject[0xd])();
    }
  }
  return;
}

Assistant:

void UpdateJoystickMenu(IJoystickConfig *selected)
{
	FMenuDescriptor **desc = MenuDescriptors.CheckKey(NAME_JoystickOptions);
	if (desc != NULL && (*desc)->mType == MDESC_OptionsMenu)
	{
		FOptionMenuDescriptor *opt = (FOptionMenuDescriptor *)*desc;
		FOptionMenuItem *it;
		for(unsigned i=0;i<opt->mItems.Size();i++)
		{
			delete opt->mItems[i];
		}
		opt->mItems.Clear();

		int i;
		int itemnum = -1;

		I_GetJoysticks(Joysticks);
		if ((unsigned)itemnum >= Joysticks.Size())
		{
			itemnum = Joysticks.Size() - 1;
		}
		if (selected != NULL)
		{
			for (i = 0; (unsigned)i < Joysticks.Size(); ++i)
			{
				if (Joysticks[i] == selected)
				{
					itemnum = i;
					break;
				}
			}
		}

		// Todo: Block joystick for changing this one.
		it = new FOptionMenuItemOption("Enable controller support", "use_joystick", "YesNo", NULL, false);
		opt->mItems.Push(it);
		#ifdef _WIN32
			it = new FOptionMenuItemOption("Enable DirectInput controllers", "joy_dinput", "YesNo", NULL, false);
			opt->mItems.Push(it);
			it = new FOptionMenuItemOption("Enable XInput controllers", "joy_xinput", "YesNo", NULL, false);
			opt->mItems.Push(it);
			it = new FOptionMenuItemOption("Enable raw PlayStation 2 adapters", "joy_ps2raw", "YesNo", NULL, false);
			opt->mItems.Push(it);
		#endif

		it = new FOptionMenuItemStaticText(" ", false);
		opt->mItems.Push(it);

		if (Joysticks.Size() == 0)
		{
			it = new FOptionMenuItemStaticText("No controllers detected", false);
			opt->mItems.Push(it);
			if (!use_joystick)
			{
				it = new FOptionMenuItemStaticText("Controller support must be", false);
				opt->mItems.Push(it);
				it = new FOptionMenuItemStaticText("enabled to detect any", false);
				opt->mItems.Push(it);
			}
		}
		else
		{
			it = new FOptionMenuItemStaticText("Configure controllers:", false);
			opt->mItems.Push(it);

			for (int i = 0; i < (int)Joysticks.Size(); ++i)
			{
				it = new FOptionMenuItemJoyConfigMenu(Joysticks[i]->GetName(), Joysticks[i]);
				opt->mItems.Push(it);
				if (i == itemnum) opt->mSelectedItem = opt->mItems.Size();
			}
		}
		if (opt->mSelectedItem >= (int)opt->mItems.Size())
		{
			opt->mSelectedItem = opt->mItems.Size() - 1;
		}

		opt->CalcIndent();

		// If the joystick config menu is open, close it if the device it's
		// open for is gone.
		for (i = 0; (unsigned)i < Joysticks.Size(); ++i)
		{
			if (Joysticks[i] == SELECTED_JOYSTICK)
			{
				break;
			}
		}
		if (i == (int)Joysticks.Size())
		{
			SELECTED_JOYSTICK = NULL;
			if (DMenu::CurrentMenu != NULL && DMenu::CurrentMenu->IsKindOf(RUNTIME_CLASS(DJoystickConfigMenu)))
			{
				DMenu::CurrentMenu->Close();
			}
		}
	}
}